

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

void pkg_createOptMatchArch(char *optMatchArch)

{
  UBool UVar1;
  int iVar2;
  FileStream *fileStream;
  char local_838 [8];
  char cmd [2048];
  FileStream *stream;
  char *obj;
  char *source;
  char *code;
  char *optMatchArch_local;
  
  fileStream = T_FileStream_open("oma.c","w");
  if (fileStream == (FileStream *)0x0) {
    fprintf(_stderr,"T_FileStream_open failed to open %s for writing\n","oma.c");
  }
  else {
    T_FileStream_writeLine(fileStream,"void oma(){}");
    T_FileStream_close(fileStream);
    sprintf(local_838,"%s %s -o %s",pkgDataFlags[6],"oma.c","oma.obj");
    iVar2 = runCommand(local_838,'\0');
    if (iVar2 == 0) {
      sprintf(optMatchArch,"%s","oma.obj");
    }
    else {
      fprintf(_stderr,"Failed to compile %s\n","oma.c");
    }
    UVar1 = T_FileStream_remove("oma.c");
    if (UVar1 == '\0') {
      fprintf(_stderr,"T_FileStream_remove failed to delete %s\n","oma.c");
    }
  }
  return;
}

Assistant:

static void pkg_createOptMatchArch(char *optMatchArch) {
#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
    const char* code = "void oma(){}";
    const char* source = "oma.c";
    const char* obj = "oma.obj";
    FileStream* stream = NULL;

    stream = T_FileStream_open(source,"w");
    if (stream != NULL) {
        T_FileStream_writeLine(stream, code);
        T_FileStream_close(stream);

        char cmd[LARGE_BUFFER_MAX_SIZE];
        sprintf(cmd, "%s %s -o %s",
            pkgDataFlags[COMPILER],
            source,
            obj);

        if (runCommand(cmd) == 0){
            sprintf(optMatchArch, "%s", obj);
        }
        else {
            fprintf(stderr, "Failed to compile %s\n", source);
        }
        if(!T_FileStream_remove(source)){
            fprintf(stderr, "T_FileStream_remove failed to delete %s\n", source);
        }
    }
    else {
        fprintf(stderr, "T_FileStream_open failed to open %s for writing\n", source);
    }
#endif
}